

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O1

zarray_t * apriltag_detector_detect(apriltag_detector_t *td,image_u8_t *im_orig)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  timeprofile_t *ptVar12;
  size_t sVar13;
  size_t sVar14;
  apriltag_family_t *paVar15;
  matd_t *pmVar16;
  bool bVar17;
  double dVar18;
  char det [8];
  apriltag_detection_t *paVar19;
  int iVar20;
  uint uVar21;
  workerpool_t *pwVar22;
  int64_t iVar23;
  char *pcVar24;
  image_u8_t *piVar25;
  image_u8_t *im;
  apriltag_detection_t *paVar26;
  apriltag_detection_t *paVar27;
  zarray_t *pzVar28;
  zarray_t *polyb;
  apriltag_detection_t *paVar29;
  FILE *pFVar30;
  image_u8x3_t *im_00;
  long lVar31;
  ulong uVar32;
  int i_1;
  void *__src;
  double (*__src_00) [2];
  char acVar33 [8];
  long lVar34;
  long lVar35;
  apriltag_detector_t *paVar36;
  int iVar37;
  int iVar38;
  int i;
  uint uVar39;
  long lVar40;
  apriltag_detection_t **p;
  double *pdVar41;
  ulong uVar42;
  double dVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  code *local_c0;
  apriltag_detection_t *local_b8 [2];
  apriltag_detection_t *det1;
  undefined8 uStack_a0;
  apriltag_detection_t *local_98;
  char local_90 [8];
  apriltag_detector_t *local_88;
  zarray_t *local_80;
  uint local_74;
  apriltag_detection_t *local_70;
  uint8_t local_63;
  char local_62;
  undefined1 local_61;
  apriltag_detection_t *local_60;
  undefined8 uStack_58;
  apriltag_detection_t *det0;
  undefined8 local_48;
  undefined8 uStack_40;
  int64_t local_38;
  
  if (td->tag_families == (zarray_t *)0x0) goto LAB_0010a2d1;
  if (td->tag_families->size == 0) {
    local_c0 = (code *)0x10a08d;
    paVar26 = (apriltag_detection_t *)calloc(1,0x18);
    paVar26->family = (apriltag_family_t *)0x8;
    local_c0 = (code *)0x10a0a5;
    printf("apriltag.c: No tag families enabled.");
    return (zarray_t *)paVar26;
  }
  if (td->wp == (workerpool_t *)0x0) {
LAB_00109eba:
    local_c0 = (code *)0x109ec4;
    workerpool_destroy(td->wp);
    local_c0 = (code *)0x109ecd;
    pwVar22 = workerpool_create(td->nthreads);
    td->wp = pwVar22;
  }
  else {
    iVar38 = td->nthreads;
    local_c0 = (code *)0x109eb6;
    iVar20 = workerpool_get_nthreads(td->wp);
    if (iVar38 != iVar20) goto LAB_00109eba;
  }
  ptVar12 = td->tp;
  pzVar28 = ptVar12->stamps;
  if (pzVar28 == (zarray_t *)0x0) {
    local_c0 = quad_decode_task;
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0x183,"void zarray_clear(zarray_t *)");
  }
  pzVar28->size = 0;
  local_c0 = (code *)0x109ef2;
  iVar23 = utime_now();
  ptVar12->utime = iVar23;
  ptVar12 = td->tp;
  local_48 = 0;
  uStack_58._0_1_ = 'i';
  uStack_58._1_1_ = 'n';
  uStack_58._2_1_ = 'i';
  uStack_58._3_1_ = 't';
  uStack_58._4_1_ = '\0';
  uStack_58._5_1_ = '\0';
  uStack_58._6_1_ = '\0';
  uStack_58._7_1_ = '\0';
  det0 = (apriltag_detection_t *)0x0;
  uStack_40 = 0;
  local_c0 = (code *)0x109f1b;
  local_38 = utime_now();
  pzVar28 = ptVar12->stamps;
  acVar33 = (char  [8])local_b8;
  if (pzVar28 != (zarray_t *)0x0) {
    iVar38 = pzVar28->alloc;
    if (iVar38 <= pzVar28->size) {
      do {
        bVar17 = iVar38 < 4;
        iVar38 = iVar38 * 2;
        if (bVar17) {
          iVar38 = 8;
        }
      } while (iVar38 <= pzVar28->size);
      pzVar28->alloc = iVar38;
      local_c0 = (code *)0x109f5b;
      pcVar24 = (char *)realloc(pzVar28->data,(long)iVar38 * pzVar28->el_sz);
      pzVar28->data = pcVar24;
    }
    local_c0 = (code *)0x109f77;
    memcpy(pzVar28->data + (long)pzVar28->size * pzVar28->el_sz,&uStack_58,pzVar28->el_sz);
    pzVar28->size = pzVar28->size + 1;
    piVar25 = im_orig;
    if (1.0 < td->quad_decimate) {
      local_c0 = (code *)0x109f99;
      piVar25 = image_u8_decimate(im_orig,td->quad_decimate);
      ptVar12 = td->tp;
      local_48 = 0;
      uStack_58._0_1_ = 'd';
      uStack_58._1_1_ = 'e';
      uStack_58._2_1_ = 'c';
      uStack_58._3_1_ = 'i';
      uStack_58._4_1_ = 'm';
      uStack_58._5_1_ = 'a';
      uStack_58._6_1_ = 't';
      uStack_58._7_1_ = 'e';
      det0 = (apriltag_detection_t *)0x0;
      uStack_40 = 0;
      local_c0 = (code *)0x109fc2;
      local_38 = utime_now();
      pzVar28 = ptVar12->stamps;
      acVar33 = (char  [8])local_b8;
      if (pzVar28 == (zarray_t *)0x0) goto LAB_0010b4d8;
      iVar38 = pzVar28->alloc;
      if (iVar38 <= pzVar28->size) {
        do {
          bVar17 = iVar38 < 4;
          iVar38 = iVar38 * 2;
          if (bVar17) {
            iVar38 = 8;
          }
        } while (iVar38 <= pzVar28->size);
        pzVar28->alloc = iVar38;
        local_c0 = (code *)0x10a002;
        pcVar24 = (char *)realloc(pzVar28->data,(long)iVar38 * pzVar28->el_sz);
        pzVar28->data = pcVar24;
      }
      local_c0 = (code *)0x10a01e;
      memcpy(pzVar28->data + (long)pzVar28->size * pzVar28->el_sz,&uStack_58,pzVar28->el_sz);
      pzVar28->size = pzVar28->size + 1;
    }
    fVar46 = td->quad_sigma;
    if ((fVar46 != 0.0) || (NAN(fVar46))) {
      fVar44 = ABS(fVar46);
      uVar39 = (int)(fVar44 * 4.0) | 1;
      if (1 < (int)uVar39) {
        if (fVar46 <= 0.0) {
          det1 = (apriltag_detection_t *)(ulong)(uint)fVar44;
          uStack_a0 = 0;
          local_c0 = (code *)0x10a0b9;
          im = image_u8_copy(piVar25);
          local_c0 = (code *)0x10a0d2;
          image_u8_gaussian_blur(piVar25,(double)det1._0_4_,uVar39);
          if (0 < im->height) {
            iVar38 = 0;
            do {
              if (0 < im->width) {
                lVar40 = 0;
                do {
                  lVar34 = (long)piVar25->stride * (long)iVar38;
                  iVar20 = (uint)im->buf[lVar40 + (long)im->stride * (long)iVar38] * 2 -
                           (uint)piVar25->buf[lVar40 + lVar34];
                  if (iVar20 < 1) {
                    iVar20 = 0;
                  }
                  if (0xfe < iVar20) {
                    iVar20 = 0xff;
                  }
                  piVar25->buf[lVar40 + lVar34] = (uint8_t)iVar20;
                  lVar40 = lVar40 + 1;
                } while ((int)lVar40 < im->width);
              }
              iVar38 = iVar38 + 1;
            } while (iVar38 < im->height);
          }
          local_c0 = (code *)0x10a13a;
          image_u8_destroy(im);
        }
        else {
          local_c0 = (code *)0x10a079;
          image_u8_gaussian_blur(piVar25,(double)fVar44,uVar39);
        }
      }
    }
    ptVar12 = td->tp;
    local_48 = 0;
    uStack_58._0_1_ = 'b';
    uStack_58._1_1_ = 'l';
    uStack_58._2_1_ = 'u';
    uStack_58._3_1_ = 'r';
    uStack_58._4_1_ = '/';
    uStack_58._5_1_ = 's';
    uStack_58._6_1_ = 'h';
    uStack_58._7_1_ = 'a';
    det0 = (apriltag_detection_t *)0x7072;
    uStack_40 = 0;
    local_c0 = (code *)0x10a160;
    local_38 = utime_now();
    pzVar28 = ptVar12->stamps;
    acVar33 = (char  [8])local_b8;
    if (pzVar28 != (zarray_t *)0x0) {
      iVar38 = pzVar28->alloc;
      if (iVar38 <= pzVar28->size) {
        do {
          bVar17 = iVar38 < 4;
          iVar38 = iVar38 * 2;
          if (bVar17) {
            iVar38 = 8;
          }
        } while (iVar38 <= pzVar28->size);
        pzVar28->alloc = iVar38;
        local_c0 = (code *)0x10a1a0;
        pcVar24 = (char *)realloc(pzVar28->data,(long)iVar38 * pzVar28->el_sz);
        pzVar28->data = pcVar24;
      }
      local_c0 = (code *)0x10a1bc;
      memcpy(pzVar28->data + (long)pzVar28->size * pzVar28->el_sz,&uStack_58,pzVar28->el_sz);
      pzVar28->size = pzVar28->size + 1;
      if (td->debug != 0) {
        local_c0 = (code *)0x10a1d6;
        image_u8_write_pnm(piVar25,"debug_preprocess.pnm");
      }
      local_c0 = (code *)0x10a1e1;
      paVar26 = (apriltag_detection_t *)apriltag_quad_thresh(td,piVar25);
      if (td->quad_decimate <= 1.0) {
LAB_0010a2f0:
        if (piVar25 != im_orig) {
          local_c0 = (code *)0x10a2fd;
          image_u8_destroy(piVar25);
        }
        local_c0 = (code *)0x10a30c;
        paVar27 = (apriltag_detection_t *)calloc(1,0x18);
        paVar27->family = (apriltag_family_t *)0x8;
        if (paVar26 != (apriltag_detection_t *)0x0) {
          td->nquads = paVar26->id;
          ptVar12 = td->tp;
          local_48 = 0;
          uStack_58._0_1_ = 'q';
          uStack_58._1_1_ = 'u';
          uStack_58._2_1_ = 'a';
          uStack_58._3_1_ = 'd';
          uStack_58._4_1_ = 's';
          uStack_58._5_1_ = '\0';
          uStack_58._6_1_ = '\0';
          uStack_58._7_1_ = '\0';
          det0 = (apriltag_detection_t *)0x0;
          uStack_40 = 0;
          local_c0 = (code *)0x10a34d;
          local_60 = paVar26;
          local_38 = utime_now();
          pzVar28 = ptVar12->stamps;
          acVar33 = (char  [8])local_b8;
          if (pzVar28 != (zarray_t *)0x0) {
            iVar38 = pzVar28->alloc;
            if (iVar38 <= pzVar28->size) {
              do {
                bVar17 = iVar38 < 4;
                iVar38 = iVar38 * 2;
                if (bVar17) {
                  iVar38 = 8;
                }
              } while (iVar38 <= pzVar28->size);
              pzVar28->alloc = iVar38;
              local_c0 = (code *)0x10a38d;
              pcVar24 = (char *)realloc(pzVar28->data,(long)iVar38 * pzVar28->el_sz);
              pzVar28->data = pcVar24;
            }
            local_c0 = (code *)0x10a3a9;
            memcpy(pzVar28->data + (long)pzVar28->size * pzVar28->el_sz,&uStack_58,pzVar28->el_sz);
            pzVar28->size = pzVar28->size + 1;
            local_98 = (apriltag_detection_t *)im_orig;
            local_88 = td;
            local_70 = paVar27;
            if (td->debug != 0) {
              local_c0 = (code *)0x10a3cf;
              piVar25 = image_u8_copy(im_orig);
              local_c0 = (code *)0x10a3da;
              image_u8_darken(piVar25);
              local_c0 = (code *)0x10a3e2;
              image_u8_darken(piVar25);
              local_c0 = (code *)0x10a3e9;
              srandom(0);
              if (0 < local_60->id) {
                lVar40 = 0;
                do {
                  pcVar24 = *(char **)&local_60->decision_margin;
                  lVar35 = (long)local_60->family * lVar40;
                  local_c0 = (code *)0x10a40a;
                  lVar34 = random();
                  iVar38 = (int)lVar34 +
                           ((int)(SUB168(SEXT816(lVar34) * SEXT816(0x69b4069b4069b407),8) >> 6) -
                           (SUB164(SEXT816(lVar34) * SEXT816(0x69b4069b4069b407),0xc) >> 0x1f)) *
                           -0x9b + 100;
                  local_c0 = (code *)0x10a460;
                  image_u8_draw_line(piVar25,*(float *)(pcVar24 + lVar35),
                                     *(float *)(pcVar24 + lVar35 + 4),
                                     *(float *)(pcVar24 + lVar35 + 8),
                                     *(float *)(pcVar24 + lVar35 + 0xc),iVar38,1);
                  local_c0 = (code *)0x10a48c;
                  image_u8_draw_line(piVar25,*(float *)(pcVar24 + lVar35 + 8),
                                     *(float *)(pcVar24 + lVar35 + 0xc),
                                     *(float *)(pcVar24 + lVar35 + 0x10),
                                     *(float *)(pcVar24 + lVar35 + 0x14),iVar38,1);
                  local_c0 = (code *)0x10a4b8;
                  image_u8_draw_line(piVar25,*(float *)(pcVar24 + lVar35 + 0x10),
                                     *(float *)(pcVar24 + lVar35 + 0x14),
                                     *(float *)(pcVar24 + lVar35 + 0x18),
                                     *(float *)(pcVar24 + lVar35 + 0x1c),iVar38,1);
                  local_c0 = (code *)0x10a4e4;
                  image_u8_draw_line(piVar25,*(float *)(pcVar24 + lVar35 + 0x18),
                                     *(float *)(pcVar24 + lVar35 + 0x1c),
                                     *(float *)(pcVar24 + lVar35),*(float *)(pcVar24 + lVar35 + 4),
                                     iVar38,1);
                  lVar40 = lVar40 + 1;
                } while (lVar40 < local_60->id);
              }
              local_c0 = (code *)0x10a507;
              image_u8_write_pnm(piVar25,"debug_quads_raw.pnm");
              local_c0 = (code *)0x10a50f;
              image_u8_destroy(piVar25);
            }
            paVar36 = local_88;
            if (local_88->debug == 0) {
              paVar26 = (apriltag_detection_t *)0x0;
            }
            else {
              local_c0 = (code *)0x10a52a;
              paVar26 = (apriltag_detection_t *)image_u8_copy((image_u8_t *)local_98);
            }
            paVar29 = local_70;
            paVar27 = local_98;
            iVar20 = local_60->id / (paVar36->nthreads * 10) + 1;
            uVar42 = (ulong)(local_60->id / iVar20 + 1);
            p = local_b8 + uVar42 * -6;
            iVar38 = local_60->id;
            local_90 = (char  [8])local_b8;
            if (0 < iVar38) {
              iVar37 = 0;
              det1 = paVar26;
              local_90 = (char  [8])local_b8;
              do {
                paVar19 = local_60;
                paVar26 = det1;
                *(int *)p = iVar37;
                iVar37 = iVar37 + iVar20;
                if (iVar37 <= iVar38) {
                  iVar38 = iVar37;
                }
                *(int *)((long)p + 4) = iVar38;
                p[1] = paVar19;
                p[2] = (apriltag_detection_t *)paVar36;
                p[3] = paVar27;
                p[4] = paVar29;
                p[5] = paVar26;
                pwVar22 = paVar36->wp;
                (&local_c0)[uVar42 * -6] = (code *)0x10a5c3;
                workerpool_add_task(pwVar22,quad_decode_task,p);
                iVar38 = local_60->id;
                p = p + 6;
                paVar26 = det1;
                paVar36 = local_88;
              } while (iVar37 < iVar38);
            }
            pwVar22 = paVar36->wp;
            (&local_c0)[uVar42 * -6] = (code *)0x10a5ed;
            workerpool_run(pwVar22);
            if (paVar26 != (apriltag_detection_t *)0x0) {
              (&local_c0)[uVar42 * -6] = (code *)0x10a601;
              image_u8_write_pnm((image_u8_t *)paVar26,"debug_samples.pnm");
              (&local_c0)[uVar42 * -6] = (code *)0x10a609;
              image_u8_destroy((image_u8_t *)paVar26);
            }
            acVar33 = local_90;
            paVar26 = local_98;
            if (paVar36->debug != 0) {
              *(undefined8 *)((long)local_90 + -8) = 0x10a628;
              piVar25 = image_u8_copy((image_u8_t *)paVar26);
              *(undefined8 *)((long)acVar33 + -8) = 0x10a633;
              image_u8_darken(piVar25);
              *(undefined8 *)((long)acVar33 + -8) = 0x10a63b;
              image_u8_darken(piVar25);
              *(undefined8 *)((long)acVar33 + -8) = 0x10a642;
              srandom(0);
              if (0 < local_60->id) {
                lVar40 = 0;
                do {
                  pcVar24 = *(char **)&local_60->decision_margin;
                  lVar35 = (long)local_60->family * lVar40;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10a663;
                  lVar34 = random();
                  iVar38 = (int)lVar34 +
                           ((int)(SUB168(SEXT816(lVar34) * SEXT816(0x69b4069b4069b407),8) >> 6) -
                           (SUB164(SEXT816(lVar34) * SEXT816(0x69b4069b4069b407),0xc) >> 0x1f)) *
                           -0x9b + 100;
                  fVar46 = *(float *)(pcVar24 + lVar35);
                  fVar44 = *(float *)(pcVar24 + lVar35 + 4);
                  fVar45 = *(float *)(pcVar24 + lVar35 + 8);
                  fVar1 = *(float *)(pcVar24 + lVar35 + 0xc);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10a6b9;
                  image_u8_draw_line(piVar25,fVar46,fVar44,fVar45,fVar1,iVar38,1);
                  fVar46 = *(float *)(pcVar24 + lVar35 + 8);
                  fVar44 = *(float *)(pcVar24 + lVar35 + 0xc);
                  fVar45 = *(float *)(pcVar24 + lVar35 + 0x10);
                  fVar1 = *(float *)(pcVar24 + lVar35 + 0x14);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10a6e5;
                  image_u8_draw_line(piVar25,fVar46,fVar44,fVar45,fVar1,iVar38,1);
                  fVar46 = *(float *)(pcVar24 + lVar35 + 0x10);
                  fVar44 = *(float *)(pcVar24 + lVar35 + 0x14);
                  fVar45 = *(float *)(pcVar24 + lVar35 + 0x18);
                  fVar1 = *(float *)(pcVar24 + lVar35 + 0x1c);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10a711;
                  image_u8_draw_line(piVar25,fVar46,fVar44,fVar45,fVar1,iVar38,1);
                  fVar46 = *(float *)(pcVar24 + lVar35 + 0x18);
                  fVar44 = *(float *)(pcVar24 + lVar35 + 0x1c);
                  fVar45 = *(float *)(pcVar24 + lVar35);
                  fVar1 = *(float *)(pcVar24 + lVar35 + 4);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10a73d;
                  image_u8_draw_line(piVar25,fVar46,fVar44,fVar45,fVar1,iVar38,1);
                  lVar40 = lVar40 + 1;
                } while (lVar40 < local_60->id);
              }
              *(undefined8 *)((long)acVar33 + -8) = 0x10a760;
              image_u8_write_pnm(piVar25,"debug_quads_fixed.pnm");
              *(undefined8 *)((long)acVar33 + -8) = 0x10a768;
              image_u8_destroy(piVar25);
              paVar36 = local_88;
            }
            ptVar12 = paVar36->tp;
            local_48 = 0x74;
            uStack_58._0_1_ = 'd';
            uStack_58._1_1_ = 'e';
            uStack_58._2_1_ = 'c';
            uStack_58._3_1_ = 'o';
            uStack_58._4_1_ = 'd';
            uStack_58._5_1_ = 'e';
            uStack_58._6_1_ = '+';
            uStack_58._7_1_ = 'r';
            det0 = (apriltag_detection_t *)0x6e656d656e696665;
            uStack_40 = 0;
            *(undefined8 *)((long)acVar33 + -8) = 0x10a792;
            local_38 = utime_now();
            paVar26 = local_70;
            pzVar28 = ptVar12->stamps;
            if (pzVar28 != (zarray_t *)0x0) {
              iVar38 = pzVar28->alloc;
              if (iVar38 <= pzVar28->size) {
                do {
                  bVar17 = iVar38 < 4;
                  iVar38 = iVar38 * 2;
                  if (bVar17) {
                    iVar38 = 8;
                  }
                } while (iVar38 <= pzVar28->size);
                pzVar28->alloc = iVar38;
                pcVar24 = pzVar28->data;
                sVar13 = pzVar28->el_sz;
                *(undefined8 *)((long)acVar33 + -8) = 0x10a7d6;
                pcVar24 = (char *)realloc(pcVar24,(long)iVar38 * sVar13);
                pzVar28->data = pcVar24;
              }
              iVar38 = pzVar28->size;
              sVar14 = pzVar28->el_sz;
              pcVar24 = pzVar28->data;
              *(undefined8 *)((long)acVar33 + -8) = 0x10a7f2;
              memcpy(pcVar24 + (long)iVar38 * sVar14,&uStack_58,sVar14);
              pzVar28->size = pzVar28->size + 1;
              *(undefined8 *)((long)acVar33 + -8) = 0x10a7ff;
              pzVar28 = g2d_polygon_create_zeros(4);
              *(undefined8 *)((long)acVar33 + -8) = 0x10a80c;
              polyb = g2d_polygon_create_zeros(4);
              if (0 < paVar26->id) {
                paVar27 = (apriltag_detection_t *)0x0;
                local_80 = pzVar28;
                do {
                  if ((int)paVar27 < 0) {
LAB_0010b45c:
                    *(undefined8 *)((long)acVar33 + -8) = 0x10b47b;
                    __assert_fail("idx >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                                  ,199,"void zarray_get(const zarray_t *, int, void *)");
                  }
                  paVar15 = paVar26->family;
                  pcVar24 = *(char **)&paVar26->decision_margin;
                  det1 = paVar27;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10a845;
                  memcpy(&uStack_58,pcVar24 + (long)paVar27 * (long)paVar15,(size_t)paVar15);
                  if (pzVar28 == (zarray_t *)0x0) {
LAB_0010b47b:
                    *(undefined8 *)((long)acVar33 + -8) = 0x10b49a;
                    __assert_fail("za != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                                  ,0x155,"void zarray_set(zarray_t *, int, const void *, void *)");
                  }
                  __src = (void *)((long)uStack_58 + 0x30);
                  lVar40 = 0;
                  do {
                    if (pzVar28->size <= lVar40) {
LAB_0010b43d:
                      *(undefined8 *)((long)acVar33 + -8) = 0x10b45c;
                      __assert_fail("idx < za->size",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                                    ,0x158,"void zarray_set(zarray_t *, int, const void *, void *)")
                      ;
                    }
                    sVar14 = pzVar28->el_sz;
                    pcVar24 = pzVar28->data;
                    *(undefined8 *)((long)acVar33 + -8) = 0x10a87f;
                    memcpy(pcVar24 + sVar14 * lVar40,__src,sVar14);
                    lVar40 = lVar40 + 1;
                    __src = (void *)((long)__src + 0x10);
                  } while (lVar40 != 4);
                  local_74 = (uint)det1;
                  uVar39 = local_74 + 1;
                  if ((int)uVar39 < paVar26->id) {
                    local_90[0] = (char)uStack_58;
                    local_90[1] = uStack_58._1_1_;
                    local_90[2] = uStack_58._2_1_;
                    local_90[3] = uStack_58._3_1_;
                    local_90[4] = uStack_58._4_1_;
                    local_90[5] = uStack_58._5_1_;
                    local_90[6] = uStack_58._6_1_;
                    local_90[7] = uStack_58._7_1_;
                    paVar27 = det1;
                    do {
                      paVar29 = (apriltag_detection_t *)(ulong)uVar39;
                      if ((int)paVar27 < -1) goto LAB_0010b45c;
                      paVar15 = paVar26->family;
                      pcVar24 = *(char **)&paVar26->decision_margin;
                      det1 = paVar27;
                      *(undefined8 *)((long)acVar33 + -8) = 0x10a8dc;
                      memcpy(local_b8 + 1,pcVar24 + (long)paVar15 * (long)paVar29,(size_t)paVar15);
                      paVar27 = local_b8[1];
                      iVar38 = 0x1f;
                      pzVar28 = local_80;
                      if ((*(int *)((long)local_90 + 8) == local_b8[1]->id) &&
                         (*(apriltag_family_t **)local_90 == local_b8[1]->family)) {
                        local_b8[0] = paVar29;
                        if (polyb == (zarray_t *)0x0) goto LAB_0010b47b;
                        __src_00 = local_b8[1]->p;
                        lVar40 = 0;
                        do {
                          if (polyb->size <= lVar40) goto LAB_0010b43d;
                          sVar14 = polyb->el_sz;
                          pcVar24 = polyb->data;
                          *(undefined8 *)((long)acVar33 + -8) = 0x10a961;
                          memcpy(pcVar24 + sVar14 * lVar40,__src_00,sVar14);
                          pzVar28 = local_80;
                          lVar40 = lVar40 + 1;
                          __src_00 = __src_00 + 1;
                        } while (lVar40 != 4);
                        *(undefined8 *)((long)acVar33 + -8) = 0x10a97a;
                        iVar20 = g2d_polygon_overlaps_polygon(pzVar28,polyb);
                        paVar26 = local_70;
                        iVar38 = 0;
                        pzVar28 = local_80;
                        if (iVar20 != 0) {
                          uVar21 = (uint)(paVar27->hamming < *(int *)((long)local_90 + 0xc));
                          if (*(int *)((long)local_90 + 0xc) < paVar27->hamming) {
                            uVar21 = 0xffffffff;
                          }
                          if (uVar21 == 0) {
                            uVar21 = 0xffffffff;
                            if (*(float *)((long)local_90 + 0x10) <= paVar27->decision_margin) {
                              uVar21 = (uint)(*(float *)((long)local_90 + 0x10) <
                                             paVar27->decision_margin);
                            }
                          }
                          lVar40 = 0x38;
                          do {
                            if (uVar21 == 0) {
                              dVar18 = *(double *)((long)local_90 + -8 + lVar40);
                              dVar6 = *(double *)((long)paVar27->c + lVar40 + -0x28);
                              uVar21 = 0xffffffff;
                              if (dVar6 <= dVar18) {
                                uVar21 = (uint)(dVar6 < dVar18);
                              }
                            }
                            if (uVar21 == 0) {
                              dVar18 = *(double *)((long)paVar27->c + lVar40 + -0x20);
                              uVar21 = 0xffffffff;
                              if (dVar18 <= *(double *)((long)local_90 + lVar40)) {
                                uVar21 = (uint)(dVar18 < *(double *)((long)local_90 + lVar40));
                              }
                            }
                            lVar40 = lVar40 + 0x10;
                          } while (lVar40 != 0x78);
                          if (uVar21 == 0) {
                            *(undefined8 *)((long)acVar33 + -8) = 0x10aa35;
                            puts("uh oh, no preference for overlappingdetection");
                          }
                          det = local_90;
                          if ((int)uVar21 < 0) {
                            *(undefined8 *)((long)acVar33 + -8) = 0x10aaae;
                            apriltag_detection_destroy(paVar27);
                            pzVar28 = local_80;
                            if (paVar26->id <= (int)uVar39) goto LAB_0010b49a;
                            uVar21 = paVar26->id - 1;
                            if ((int)uVar39 < (int)uVar21) {
                              paVar15 = paVar26->family;
                              pcVar24 = *(char **)&paVar26->decision_margin;
                              lVar40 = (long)local_b8[0] * (long)paVar15;
                              *(undefined8 *)((long)acVar33 + -8) = 0x10aae9;
                              memcpy(pcVar24 + lVar40,pcVar24 + (ulong)uVar21 * (long)paVar15,
                                     (size_t)paVar15);
                            }
                            paVar26->id = paVar26->id + -1;
                            iVar38 = 0;
                            paVar29 = det1;
                          }
                          else {
                            *(undefined8 *)((long)acVar33 + -8) = 0x10aa45;
                            apriltag_detection_destroy((apriltag_detection_t *)det);
                            uVar39 = local_74;
                            pzVar28 = local_80;
                            if ((int)local_74 < 0) {
                              *(undefined8 *)((long)acVar33 + -8) = 0x10b4d8;
                              __assert_fail("idx >= 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                                            ,0x101,"void zarray_remove_index(zarray_t *, int, int)")
                              ;
                            }
                            if (paVar26->id <= (int)local_74) {
LAB_0010b49a:
                              *(undefined8 *)((long)acVar33 + -8) = 0x10b4b9;
                              __assert_fail("idx < za->size",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                                            ,0x102,"void zarray_remove_index(zarray_t *, int, int)")
                              ;
                            }
                            uVar21 = paVar26->id - 1;
                            if ((int)local_74 < (int)uVar21) {
                              paVar15 = paVar26->family;
                              pcVar24 = *(char **)&paVar26->decision_margin;
                              uVar42 = (ulong)local_74;
                              *(undefined8 *)((long)acVar33 + -8) = 0x10aa84;
                              memcpy(pcVar24 + uVar42 * (long)paVar15,
                                     pcVar24 + (ulong)uVar21 * (long)paVar15,(size_t)paVar15);
                            }
                            paVar26->id = paVar26->id + -1;
                            local_74 = uVar39 - 1;
                            iVar38 = 0x27;
                          }
                        }
                      }
                    } while (((iVar38 == 0x1f) || (iVar38 == 0)) &&
                            (uVar39 = (int)paVar29 + 1, paVar27 = paVar29, (int)uVar39 < paVar26->id
                            ));
                  }
                  paVar27 = (apriltag_detection_t *)(ulong)(local_74 + 1);
                } while ((int)(local_74 + 1) < paVar26->id);
              }
              if (pzVar28 != (zarray_t *)0x0) {
                pcVar24 = pzVar28->data;
                if (pcVar24 != (char *)0x0) {
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ab23;
                  free(pcVar24);
                }
                pzVar28->el_sz = 0;
                pzVar28->size = 0;
                pzVar28->alloc = 0;
                pzVar28->data = (char *)0x0;
                *(undefined8 *)((long)acVar33 + -8) = 0x10ab3c;
                free(pzVar28);
              }
              if (polyb != (zarray_t *)0x0) {
                pcVar24 = polyb->data;
                if (pcVar24 != (char *)0x0) {
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ab4f;
                  free(pcVar24);
                }
                polyb->el_sz = 0;
                polyb->size = 0;
                polyb->alloc = 0;
                polyb->data = (char *)0x0;
                *(undefined8 *)((long)acVar33 + -8) = 0x10ab67;
                free(polyb);
              }
              paVar36 = local_88;
              ptVar12 = local_88->tp;
              local_48 = 0;
              uStack_58._0_1_ = 'r';
              uStack_58._1_1_ = 'e';
              uStack_58._2_1_ = 'c';
              uStack_58._3_1_ = 'o';
              uStack_58._4_1_ = 'n';
              uStack_58._5_1_ = 'c';
              uStack_58._6_1_ = 'i';
              uStack_58._7_1_ = 'l';
              det0 = (apriltag_detection_t *)0x65;
              uStack_40 = 0;
              *(undefined8 *)((long)acVar33 + -8) = 0x10ab93;
              local_38 = utime_now();
              paVar26 = local_98;
              pzVar28 = ptVar12->stamps;
              if (pzVar28 != (zarray_t *)0x0) {
                iVar38 = pzVar28->alloc;
                if (iVar38 <= pzVar28->size) {
                  do {
                    bVar17 = iVar38 < 4;
                    iVar38 = iVar38 * 2;
                    if (bVar17) {
                      iVar38 = 8;
                    }
                  } while (iVar38 <= pzVar28->size);
                  pzVar28->alloc = iVar38;
                  pcVar24 = pzVar28->data;
                  sVar13 = pzVar28->el_sz;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10abda;
                  pcVar24 = (char *)realloc(pcVar24,(long)iVar38 * sVar13);
                  pzVar28->data = pcVar24;
                }
                iVar38 = pzVar28->size;
                sVar14 = pzVar28->el_sz;
                pcVar24 = pzVar28->data;
                *(undefined8 *)((long)acVar33 + -8) = 0x10abf6;
                memcpy(pcVar24 + (long)iVar38 * sVar14,&uStack_58,sVar14);
                pzVar28->size = pzVar28->size + 1;
                if (paVar36->debug != 0) {
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ac0d;
                  piVar25 = image_u8_copy((image_u8_t *)paVar26);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ac18;
                  image_u8_darken(piVar25);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ac20;
                  image_u8_darken(piVar25);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ac33;
                  pFVar30 = fopen("debug_output.ps","w");
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ac47;
                  fprintf(pFVar30,"%%!PS\n\n");
                  dVar43 = 612.0 / (double)piVar25->width;
                  dVar18 = 792.0 / (double)piVar25->height;
                  dVar6 = dVar18;
                  if (dVar43 <= dVar18) {
                    dVar6 = dVar43;
                  }
                  uVar42 = ~-(ulong)NAN(dVar43) & (ulong)dVar6 | -(ulong)NAN(dVar43) & (ulong)dVar18
                  ;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10aca2;
                  fprintf(pFVar30,"%f %f scale\n",uVar42,uVar42);
                  uVar39 = piVar25->height;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10acb7;
                  fprintf(pFVar30,"0 %d translate\n",(ulong)uVar39);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10acd0;
                  fwrite("1 -1 scale\n",0xb,1,pFVar30);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10acdb;
                  postscript_image((FILE *)pFVar30,piVar25);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ace3;
                  image_u8_destroy(piVar25);
                  if (0 < local_70->id) {
                    lVar40 = 0;
                    do {
                      paVar15 = local_70->family;
                      pcVar24 = *(char **)&local_70->decision_margin;
                      *(undefined8 *)((long)acVar33 + -8) = 0x10ad1f;
                      memcpy(local_b8 + 1,pcVar24 + (long)paVar15 * lVar40,(size_t)paVar15);
                      lVar34 = 0;
                      do {
                        *(undefined8 *)((long)acVar33 + -8) = 0x10ad27;
                        lVar35 = random();
                        *(float *)((long)&uStack_58 + lVar34 * 4) = (float)(lVar35 % 0x9b + 100);
                        lVar34 = lVar34 + 1;
                      } while (lVar34 != 3);
                      fVar46 = (float)uStack_58 / 255.0;
                      fVar44 = uStack_58._4_4_ / 255.0;
                      fVar45 = det0._0_4_ / 255.0;
                      *(undefined8 *)((long)acVar33 + -8) = 0x10ada4;
                      fprintf(pFVar30,"%f %f %f setrgbcolor\n",(double)fVar46,(double)fVar44,
                              SUB84((double)fVar45,0));
                      dVar18 = local_b8[1]->p[0][0];
                      dVar6 = local_b8[1]->p[0][1];
                      dVar43 = local_b8[1]->p[1][0];
                      dVar7 = local_b8[1]->p[1][1];
                      dVar8 = local_b8[1]->p[2][0];
                      dVar9 = local_b8[1]->p[2][1];
                      dVar10 = local_b8[1]->p[3][0];
                      dVar11 = local_b8[1]->p[3][1];
                      *(double *)((long)acVar33 + -8) = dVar6;
                      *(double *)((long)acVar33 + -0x10) = dVar18;
                      *(undefined8 *)((long)acVar33 + -0x18) = 0x10adef;
                      fprintf(pFVar30,
                              "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n"
                              ,dVar18,dVar6,SUB84(dVar43,0),SUB84(dVar7,0),dVar8,dVar9,dVar10,dVar11
                             );
                      lVar40 = lVar40 + 1;
                    } while (lVar40 < local_70->id);
                  }
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ae20;
                  fwrite("showpage\n",9,1,pFVar30);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ae28;
                  fclose(pFVar30);
                  paVar36 = local_88;
                  paVar26 = local_98;
                }
                if (paVar36->debug != 0) {
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ae47;
                  piVar25 = image_u8_copy((image_u8_t *)paVar26);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ae52;
                  image_u8_darken(piVar25);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ae5a;
                  image_u8_darken(piVar25);
                  uVar39 = piVar25->width;
                  uVar21 = piVar25->height;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10ae64;
                  im_00 = image_u8x3_create(uVar39,uVar21);
                  if (0 < *(int *)((long)&paVar26->family + 4)) {
                    iVar38 = 0;
                    do {
                      if (0 < *(int *)&paVar26->family) {
                        lVar40 = 2;
                        lVar34 = (long)iVar38;
                        lVar35 = 0;
                        do {
                          im_00->buf[lVar40 + -2 + im_00->stride * lVar34] =
                               piVar25->buf[lVar35 + piVar25->stride * lVar34];
                          im_00->buf[lVar40 + -1 + im_00->stride * lVar34] =
                               piVar25->buf[lVar35 + piVar25->stride * lVar34];
                          im_00->buf[lVar40 + im_00->stride * lVar34] =
                               piVar25->buf[lVar35 + piVar25->stride * lVar34];
                          lVar35 = lVar35 + 1;
                          lVar40 = lVar40 + 3;
                        } while ((int)lVar35 < *(int *)&paVar26->family);
                      }
                      iVar38 = iVar38 + 1;
                    } while (iVar38 < *(int *)((long)&paVar26->family + 4));
                  }
                  if (0 < local_70->id) {
                    pzVar28 = (zarray_t *)0x0;
                    do {
                      paVar15 = local_70->family;
                      pcVar24 = *(char **)&local_70->decision_margin;
                      local_80 = pzVar28;
                      *(undefined8 *)((long)acVar33 + -8) = 0x10af36;
                      memcpy(local_b8 + 1,pcVar24 + (long)paVar15 * (long)pzVar28,(size_t)paVar15);
                      lVar40 = 0;
                      do {
                        *(undefined8 *)((long)acVar33 + -8) = 0x10af3d;
                        lVar34 = random();
                        paVar26 = local_b8[1];
                        *(float *)((long)&uStack_58 + lVar40 * 4) = (float)(lVar34 % 0x9b + 100);
                        lVar40 = lVar40 + 1;
                      } while (lVar40 != 3);
                      det1 = (apriltag_detection_t *)CONCAT44(det1._4_4_,(int)(float)uStack_58);
                      iVar38 = (int)uStack_58._4_4_;
                      local_90[0] = (char)iVar38;
                      local_90[1] = (char)((uint)iVar38 >> 8);
                      local_90[2] = (char)((uint)iVar38 >> 0x10);
                      local_90[3] = (char)((uint)iVar38 >> 0x18);
                      iVar38 = (int)det0._0_4_;
                      pdVar41 = local_b8[1]->p[0] + 1;
                      lVar40 = 1;
                      do {
                        dVar18 = (*(double (*) [2])(pdVar41 + -1))[0];
                        dVar6 = *pdVar41;
                        uVar42 = (ulong)(((uint)lVar40 & 3) << 4);
                        dVar43 = *(double *)((long)paVar26->p[0] + uVar42);
                        dVar7 = *(double *)((long)paVar26->p[0] + uVar42 + 8);
                        local_63 = (uint8_t)det1;
                        local_62 = local_90[0];
                        local_61 = (undefined1)iVar38;
                        *(undefined8 *)((long)acVar33 + -8) = 0x10affc;
                        image_u8x3_draw_line
                                  (im_00,(float)dVar18,(float)dVar6,(float)dVar43,(float)dVar7,
                                   &local_63,1);
                        pdVar41 = pdVar41 + 2;
                        lVar40 = lVar40 + 1;
                      } while (lVar40 != 5);
                      pzVar28 = (zarray_t *)((long)&local_80->el_sz + 1);
                    } while ((long)pzVar28 < (long)local_70->id);
                  }
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b03a;
                  image_u8x3_write_pnm(im_00,"debug_output.pnm");
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b042;
                  image_u8x3_destroy(im_00);
                  paVar36 = local_88;
                  paVar26 = local_98;
                }
                paVar27 = local_60;
                if (paVar36->debug != 0) {
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b070;
                  pFVar30 = fopen("debug_quads.ps","w");
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b084;
                  fprintf(pFVar30,"%%!PS\n\n");
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b08c;
                  piVar25 = image_u8_copy((image_u8_t *)paVar26);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b097;
                  image_u8_darken(piVar25);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b09f;
                  image_u8_darken(piVar25);
                  dVar43 = 612.0 / (double)piVar25->width;
                  dVar18 = 792.0 / (double)piVar25->height;
                  dVar6 = dVar18;
                  if (dVar43 <= dVar18) {
                    dVar6 = dVar43;
                  }
                  uVar42 = ~-(ulong)NAN(dVar43) & (ulong)dVar6 | -(ulong)NAN(dVar43) & (ulong)dVar18
                  ;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b0fa;
                  fprintf(pFVar30,"%f %f scale\n",uVar42,uVar42);
                  uVar39 = piVar25->height;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b10f;
                  fprintf(pFVar30,"0 %d translate\n",(ulong)uVar39);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b128;
                  fwrite("1 -1 scale\n",0xb,1,pFVar30);
                  det1 = (apriltag_detection_t *)pFVar30;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b13a;
                  postscript_image((FILE *)pFVar30,piVar25);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b142;
                  image_u8_destroy(piVar25);
                  if (0 < paVar27->id) {
                    lVar40 = 0;
                    do {
                      pcVar24 = *(char **)&paVar27->decision_margin;
                      lVar35 = (long)paVar27->family * lVar40;
                      lVar34 = 0;
                      do {
                        *(undefined8 *)((long)acVar33 + -8) = 0x10b16b;
                        lVar31 = random();
                        paVar26 = det1;
                        *(float *)((long)&uStack_58 + lVar34 * 4) = (float)(lVar31 % 0x9b + 100);
                        lVar34 = lVar34 + 1;
                      } while (lVar34 != 3);
                      fVar46 = (float)uStack_58 / 255.0;
                      fVar44 = uStack_58._4_4_ / 255.0;
                      fVar45 = det0._0_4_ / 255.0;
                      *(undefined8 *)((long)acVar33 + -8) = 0x10b1ee;
                      fprintf((FILE *)paVar26,"%f %f %f setrgbcolor\n",(double)fVar46,(double)fVar44
                              ,SUB84((double)fVar45,0));
                      fVar46 = *(float *)(pcVar24 + lVar35);
                      fVar44 = *(float *)(pcVar24 + lVar35 + 4);
                      fVar45 = *(float *)(pcVar24 + lVar35 + 8);
                      fVar1 = *(float *)(pcVar24 + lVar35 + 0xc);
                      fVar2 = *(float *)(pcVar24 + lVar35 + 0x10);
                      fVar3 = *(float *)(pcVar24 + lVar35 + 0x14);
                      fVar4 = *(float *)(pcVar24 + lVar35 + 0x18);
                      fVar5 = *(float *)(pcVar24 + lVar35 + 0x1c);
                      *(double *)((long)acVar33 + -8) = (double)fVar44;
                      *(double *)((long)acVar33 + -0x10) = (double)fVar46;
                      *(undefined8 *)((long)acVar33 + -0x18) = 0x10b25d;
                      fprintf((FILE *)paVar26,
                              "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n"
                              ,(double)fVar46,(double)fVar44,SUB84((double)fVar45,0),
                              SUB84((double)fVar1,0),(double)fVar2,(double)fVar3,(double)fVar4,
                              (double)fVar5);
                      lVar40 = lVar40 + 1;
                      paVar27 = local_60;
                    } while (lVar40 < local_60->id);
                  }
                  paVar26 = det1;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b295;
                  fwrite("showpage\n",9,1,(FILE *)paVar26);
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b29d;
                  fclose((FILE *)paVar26);
                  paVar36 = local_88;
                }
                ptVar12 = paVar36->tp;
                local_48 = 0;
                uStack_58._0_1_ = 'd';
                uStack_58._1_1_ = 'e';
                uStack_58._2_1_ = 'b';
                uStack_58._3_1_ = 'u';
                uStack_58._4_1_ = 'g';
                uStack_58._5_1_ = ' ';
                uStack_58._6_1_ = 'o';
                uStack_58._7_1_ = 'u';
                det0 = (apriltag_detection_t *)0x74757074;
                uStack_40 = 0;
                *(undefined8 *)((long)acVar33 + -8) = 0x10b2c7;
                local_38 = utime_now();
                pzVar28 = ptVar12->stamps;
                if (pzVar28 != (zarray_t *)0x0) {
                  iVar38 = pzVar28->alloc;
                  if (iVar38 <= pzVar28->size) {
                    do {
                      bVar17 = iVar38 < 4;
                      iVar38 = iVar38 * 2;
                      if (bVar17) {
                        iVar38 = 8;
                      }
                    } while (iVar38 <= pzVar28->size);
                    pzVar28->alloc = iVar38;
                    pcVar24 = pzVar28->data;
                    sVar13 = pzVar28->el_sz;
                    *(undefined8 *)((long)acVar33 + -8) = 0x10b307;
                    pcVar24 = (char *)realloc(pcVar24,(long)iVar38 * sVar13);
                    pzVar28->data = pcVar24;
                  }
                  iVar38 = pzVar28->size;
                  sVar14 = pzVar28->el_sz;
                  pcVar24 = pzVar28->data;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b323;
                  memcpy(pcVar24 + (long)iVar38 * sVar14,&uStack_58,sVar14);
                  paVar26 = local_60;
                  pzVar28->size = pzVar28->size + 1;
                  if (0 < local_60->id) {
                    lVar40 = 0;
                    do {
                      pcVar24 = *(char **)&paVar26->decision_margin;
                      lVar34 = (long)paVar26->family * lVar40;
                      pmVar16 = *(matd_t **)(pcVar24 + lVar34 + 0x28);
                      *(undefined8 *)((long)acVar33 + -8) = 0x10b349;
                      matd_destroy(pmVar16);
                      pmVar16 = *(matd_t **)(pcVar24 + lVar34 + 0x30);
                      *(undefined8 *)((long)acVar33 + -8) = 0x10b353;
                      matd_destroy(pmVar16);
                      lVar40 = lVar40 + 1;
                    } while (lVar40 < paVar26->id);
                  }
                  pcVar24 = *(char **)&paVar26->decision_margin;
                  if (pcVar24 != (char *)0x0) {
                    *(undefined8 *)((long)acVar33 + -8) = 0x10b370;
                    free(pcVar24);
                  }
                  paVar26->family = (apriltag_family_t *)0x0;
                  *(undefined8 *)&paVar26->id = 0;
                  *(char **)&paVar26->decision_margin = (char *)0x0;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b386;
                  free(paVar26);
                  paVar26 = local_70;
                  iVar38 = local_70->id;
                  if ((long)iVar38 != 0) {
                    paVar15 = local_70->family;
                    pcVar24 = *(char **)&local_70->decision_margin;
                    *(undefined8 *)((long)acVar33 + -8) = 0x10b3a6;
                    qsort(pcVar24,(long)iVar38,(size_t)paVar15,detection_compare_function);
                  }
                  ptVar12 = paVar36->tp;
                  local_48 = 0;
                  uStack_58._0_1_ = 'c';
                  uStack_58._1_1_ = 'l';
                  uStack_58._2_1_ = 'e';
                  uStack_58._3_1_ = 'a';
                  uStack_58._4_1_ = 'n';
                  uStack_58._5_1_ = 'u';
                  uStack_58._6_1_ = 'p';
                  uStack_58._7_1_ = '\0';
                  det0 = (apriltag_detection_t *)0x0;
                  uStack_40 = 0;
                  *(undefined8 *)((long)acVar33 + -8) = 0x10b3cc;
                  local_38 = utime_now();
                  pzVar28 = ptVar12->stamps;
                  if (pzVar28 != (zarray_t *)0x0) {
                    iVar38 = pzVar28->alloc;
                    if (iVar38 <= pzVar28->size) {
                      do {
                        bVar17 = iVar38 < 4;
                        iVar38 = iVar38 * 2;
                        if (bVar17) {
                          iVar38 = 8;
                        }
                      } while (iVar38 <= pzVar28->size);
                      pzVar28->alloc = iVar38;
                      pcVar24 = pzVar28->data;
                      sVar13 = pzVar28->el_sz;
                      *(undefined8 *)((long)acVar33 + -8) = 0x10b40c;
                      pcVar24 = (char *)realloc(pcVar24,(long)iVar38 * sVar13);
                      pzVar28->data = pcVar24;
                    }
                    iVar38 = pzVar28->size;
                    sVar14 = pzVar28->el_sz;
                    pcVar24 = pzVar28->data;
                    *(undefined8 *)((long)acVar33 + -8) = 0x10b428;
                    memcpy(pcVar24 + (long)iVar38 * sVar14,&uStack_58,sVar14);
                    pzVar28->size = pzVar28->size + 1;
                    return (zarray_t *)paVar26;
                  }
                }
              }
            }
          }
          goto LAB_0010b4d8;
        }
      }
      else if (paVar26 != (apriltag_detection_t *)0x0) {
        uVar32 = 0;
        uVar42 = (ulong)(uint)paVar26->id;
        if (paVar26->id < 1) {
          uVar42 = uVar32;
        }
        do {
          if (uVar32 == uVar42) goto LAB_0010a2f0;
          pcVar24 = *(char **)&paVar26->decision_margin;
          lVar34 = (long)paVar26->family * uVar32;
          lVar40 = lVar34 + 4;
          lVar35 = 0;
          do {
            fVar46 = td->quad_decimate;
            if ((fVar46 != 1.5) || (NAN(fVar46))) {
              *(float *)(pcVar24 + lVar35 * 8 + lVar34) =
                   (*(float *)(pcVar24 + lVar35 * 8 + lVar34) + -0.5) * fVar46 + 0.5;
              fVar46 = td->quad_decimate * (*(float *)(pcVar24 + lVar35 * 8 + lVar40) + -0.5) + 0.5;
            }
            else {
              *(float *)(pcVar24 + lVar35 * 8 + lVar34) =
                   fVar46 * *(float *)(pcVar24 + lVar35 * 8 + lVar34);
              fVar46 = td->quad_decimate * *(float *)(pcVar24 + lVar35 * 8 + lVar40);
            }
            *(float *)(pcVar24 + lVar35 * 8 + lVar40) = fVar46;
            lVar35 = lVar35 + 1;
          } while (lVar35 != 4);
          uVar32 = uVar32 + 1;
        } while (paVar26 != (apriltag_detection_t *)0x0);
      }
LAB_0010a2d1:
      local_c0 = (code *)0x10a2f0;
      __assert_fail("za != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                    ,0x84,"int zarray_size(const zarray_t *)");
    }
  }
LAB_0010b4d8:
  *(undefined8 *)((long)acVar33 + -8) = 0x10b4f7;
  __assert_fail("za != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                ,0xb5,"void zarray_add(zarray_t *, const void *)");
}

Assistant:

zarray_t *apriltag_detector_detect(apriltag_detector_t *td, image_u8_t *im_orig)
{
    if (zarray_size(td->tag_families) == 0) {
        zarray_t *s = zarray_create(sizeof(apriltag_detection_t*));
        printf("apriltag.c: No tag families enabled.");
        return s;
    }

    if (td->wp == NULL || td->nthreads != workerpool_get_nthreads(td->wp)) {
        workerpool_destroy(td->wp);
        td->wp = workerpool_create(td->nthreads);
    }

    timeprofile_clear(td->tp);
    timeprofile_stamp(td->tp, "init");

    ///////////////////////////////////////////////////////////
    // Step 1. Detect quads according to requested image decimation
    // and blurring parameters.
    image_u8_t *quad_im = im_orig;
    if (td->quad_decimate > 1) {
        quad_im = image_u8_decimate(im_orig, td->quad_decimate);

        timeprofile_stamp(td->tp, "decimate");
    }

    if (td->quad_sigma != 0) {
        // compute a reasonable kernel width by figuring that the
        // kernel should go out 2 std devs.
        //
        // max sigma          ksz
        // 0.499              1  (disabled)
        // 0.999              3
        // 1.499              5
        // 1.999              7

        float sigma = fabsf((float) td->quad_sigma);

        int ksz = 4 * sigma; // 2 std devs in each direction
        if ((ksz & 1) == 0)
            ksz++;

        if (ksz > 1) {

            if (td->quad_sigma > 0) {
                // Apply a blur
                image_u8_gaussian_blur(quad_im, sigma, ksz);
            } else {
                // SHARPEN the image by subtracting the low frequency components.
                image_u8_t *orig = image_u8_copy(quad_im);
                image_u8_gaussian_blur(quad_im, sigma, ksz);

                for (int y = 0; y < orig->height; y++) {
                    for (int x = 0; x < orig->width; x++) {
                        int vorig = orig->buf[y*orig->stride + x];
                        int vblur = quad_im->buf[y*quad_im->stride + x];

                        int v = 2*vorig - vblur;
                        if (v < 0)
                            v = 0;
                        if (v > 255)
                            v = 255;

                        quad_im->buf[y*quad_im->stride + x] = (uint8_t) v;
                    }
                }
                image_u8_destroy(orig);
            }
        }
    }

    timeprofile_stamp(td->tp, "blur/sharp");

    if (td->debug)
        image_u8_write_pnm(quad_im, "debug_preprocess.pnm");

    zarray_t *quads = apriltag_quad_thresh(td, quad_im);
    
    // adjust centers of pixels so that they correspond to the
    // original full-resolution image.
    if (td->quad_decimate > 1) {
        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *q;
            zarray_get_volatile(quads, i, &q);

            for (int i = 0; i < 4; i++) {
                if (td->quad_decimate == 1.5) {
                    q->p[i][0] *= td->quad_decimate;
                    q->p[i][1] *= td->quad_decimate;
                } else {
                    q->p[i][0] = (q->p[i][0] - 0.5)*td->quad_decimate + 0.5;
                    q->p[i][1] = (q->p[i][1] - 0.5)*td->quad_decimate + 0.5;
                }
            }
        }
    }

    if (quad_im != im_orig)
        image_u8_destroy(quad_im);

    zarray_t *detections = zarray_create(sizeof(apriltag_detection_t*));

    td->nquads = zarray_size(quads);

    timeprofile_stamp(td->tp, "quads");

    if (td->debug) {
        image_u8_t *im_quads = image_u8_copy(im_orig);
        image_u8_darken(im_quads);
        image_u8_darken(im_quads);

        srandom(0);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *quad;
            zarray_get_volatile(quads, i, &quad);

            const int bias = 100;
            int color = bias + (random() % (255-bias));

            image_u8_draw_line(im_quads, quad->p[0][0], quad->p[0][1], quad->p[1][0], quad->p[1][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[1][0], quad->p[1][1], quad->p[2][0], quad->p[2][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[2][0], quad->p[2][1], quad->p[3][0], quad->p[3][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[3][0], quad->p[3][1], quad->p[0][0], quad->p[0][1], color, 1);
        }

        image_u8_write_pnm(im_quads, "debug_quads_raw.pnm");
        image_u8_destroy(im_quads);
    }

    ////////////////////////////////////////////////////////////////
    // Step 2. Decode tags from each quad.
    if (1) {
        image_u8_t *im_samples = td->debug ? image_u8_copy(im_orig) : NULL;

        int chunksize = 1 + zarray_size(quads) / (APRILTAG_TASKS_PER_THREAD_TARGET * td->nthreads);

        struct quad_decode_task tasks[zarray_size(quads) / chunksize + 1];

        int ntasks = 0;
        for (int i = 0; i < zarray_size(quads); i+= chunksize) {
            tasks[ntasks].i0 = i;
            tasks[ntasks].i1 = imin(zarray_size(quads), i + chunksize);
            tasks[ntasks].quads = quads;
            tasks[ntasks].td = td;
            tasks[ntasks].im = im_orig;
            tasks[ntasks].detections = detections;

            tasks[ntasks].im_samples = im_samples;

            workerpool_add_task(td->wp, quad_decode_task, &tasks[ntasks]);
            ntasks++;
        }

        workerpool_run(td->wp);

        if (im_samples != NULL) {
            image_u8_write_pnm(im_samples, "debug_samples.pnm");
            image_u8_destroy(im_samples);
        }
    }

    if (td->debug) {
        image_u8_t *im_quads = image_u8_copy(im_orig);
        image_u8_darken(im_quads);
        image_u8_darken(im_quads);

        srandom(0);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *quad;
            zarray_get_volatile(quads, i, &quad);

            const int bias = 100;
            int color = bias + (random() % (255-bias));

            image_u8_draw_line(im_quads, quad->p[0][0], quad->p[0][1], quad->p[1][0], quad->p[1][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[1][0], quad->p[1][1], quad->p[2][0], quad->p[2][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[2][0], quad->p[2][1], quad->p[3][0], quad->p[3][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[3][0], quad->p[3][1], quad->p[0][0], quad->p[0][1], color, 1);

        }

        image_u8_write_pnm(im_quads, "debug_quads_fixed.pnm");
        image_u8_destroy(im_quads);
    }

    timeprofile_stamp(td->tp, "decode+refinement");

    ////////////////////////////////////////////////////////////////
    // Step 3. Reconcile detections--- don't report the same tag more
    // than once. (Allow non-overlapping duplicate detections.)
    if (1) {
        zarray_t *poly0 = g2d_polygon_create_zeros(4);
        zarray_t *poly1 = g2d_polygon_create_zeros(4);

        for (int i0 = 0; i0 < zarray_size(detections); i0++) {

            apriltag_detection_t *det0;
            zarray_get(detections, i0, &det0);

            for (int k = 0; k < 4; k++)
                zarray_set(poly0, k, det0->p[k], NULL);

            for (int i1 = i0+1; i1 < zarray_size(detections); i1++) {

                apriltag_detection_t *det1;
                zarray_get(detections, i1, &det1);

                if (det0->id != det1->id || det0->family != det1->family)
                    continue;

                for (int k = 0; k < 4; k++)
                    zarray_set(poly1, k, det1->p[k], NULL);

                if (g2d_polygon_overlaps_polygon(poly0, poly1)) {
                    // the tags overlap. Delete one, keep the other.

                    int pref = 0; // 0 means undecided which one we'll keep.
                    pref = prefer_smaller(pref, det0->hamming, det1->hamming);     // want small hamming
                    pref = prefer_smaller(pref, -det0->decision_margin, -det1->decision_margin);      // want bigger margins

                    // if we STILL don't prefer one detection over the other, then pick
                    // any deterministic criterion.
                    for (int i = 0; i < 4; i++) {
                        pref = prefer_smaller(pref, det0->p[i][0], det1->p[i][0]);
                        pref = prefer_smaller(pref, det0->p[i][1], det1->p[i][1]);
                    }

                    if (pref == 0) {
                        // at this point, we should only be undecided if the tag detections
                        // are *exactly* the same. How would that happen?
                        printf("uh oh, no preference for overlappingdetection\n");
                    }

                    if (pref < 0) {
                        // keep det0, destroy det1
                        apriltag_detection_destroy(det1);
                        zarray_remove_index(detections, i1, 1);
                        i1--; // retry the same index
                        goto retry1;
                    } else {
                        // keep det1, destroy det0
                        apriltag_detection_destroy(det0);
                        zarray_remove_index(detections, i0, 1);
                        i0--; // retry the same index.
                        goto retry0;
                    }
                }

              retry1: ;
            }

          retry0: ;
        }

        zarray_destroy(poly0);
        zarray_destroy(poly1);
    }

    timeprofile_stamp(td->tp, "reconcile");

    ////////////////////////////////////////////////////////////////
    // Produce final debug output
    if (td->debug) {

        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        // assume letter, which is 612x792 points.
        FILE *f = fopen("debug_output.ps", "w");
        fprintf(f, "%%!PS\n\n");
        double scale = fmin(612.0/darker->width, 792.0/darker->height);
        fprintf(f, "%f %f scale\n", scale, scale);
        fprintf(f, "0 %d translate\n", darker->height);
        fprintf(f, "1 -1 scale\n");
        postscript_image(f, darker);

        image_u8_destroy(darker);

        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            fprintf(f, "%f %f %f setrgbcolor\n", rgb[0]/255.0f, rgb[1]/255.0f, rgb[2]/255.0f);
            fprintf(f, "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                    det->p[0][0], det->p[0][1],
                    det->p[1][0], det->p[1][1],
                    det->p[2][0], det->p[2][1],
                    det->p[3][0], det->p[3][1],
                    det->p[0][0], det->p[0][1]);
        }

        fprintf(f, "showpage\n");
        fclose(f);
    }

    if (td->debug) {
        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        image_u8x3_t *out = image_u8x3_create(darker->width, darker->height);
        for (int y = 0; y < im_orig->height; y++) {
            for (int x = 0; x < im_orig->width; x++) {
                out->buf[y*out->stride + 3*x + 0] = darker->buf[y*darker->stride + x];
                out->buf[y*out->stride + 3*x + 1] = darker->buf[y*darker->stride + x];
                out->buf[y*out->stride + 3*x + 2] = darker->buf[y*darker->stride + x];
            }
        }

        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            for (int j = 0; j < 4; j++) {
                int k = (j + 1) & 3;
                image_u8x3_draw_line(out,
                                     det->p[j][0], det->p[j][1], det->p[k][0], det->p[k][1],
                                     (uint8_t[]) { rgb[0], rgb[1], rgb[2] },
                                     1);
            }
        }

        image_u8x3_write_pnm(out, "debug_output.pnm");
        image_u8x3_destroy(out);
    }

    // deallocate
    if (td->debug) {
        FILE *f = fopen("debug_quads.ps", "w");
        fprintf(f, "%%!PS\n\n");

        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        // assume letter, which is 612x792 points.
        double scale = fmin(612.0/darker->width, 792.0/darker->height);
        fprintf(f, "%f %f scale\n", scale, scale);
        fprintf(f, "0 %d translate\n", darker->height);
        fprintf(f, "1 -1 scale\n");

        postscript_image(f, darker);

        image_u8_destroy(darker);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *q;
            zarray_get_volatile(quads, i, &q);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            fprintf(f, "%f %f %f setrgbcolor\n", rgb[0]/255.0f, rgb[1]/255.0f, rgb[2]/255.0f);
            fprintf(f, "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                    q->p[0][0], q->p[0][1],
                    q->p[1][0], q->p[1][1],
                    q->p[2][0], q->p[2][1],
                    q->p[3][0], q->p[3][1],
                    q->p[0][0], q->p[0][1]);
        }

        fprintf(f, "showpage\n");
        fclose(f);
    }

    timeprofile_stamp(td->tp, "debug output");

    for (int i = 0; i < zarray_size(quads); i++) {
        struct quad *quad;
        zarray_get_volatile(quads, i, &quad);
        matd_destroy(quad->H);
        matd_destroy(quad->Hinv);
    }

    zarray_destroy(quads);

    zarray_sort(detections, detection_compare_function);
    timeprofile_stamp(td->tp, "cleanup");

    return detections;
}